

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::PerPatchValidator::validateSingleVariable
          (PerPatchValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  bool bVar1;
  const_reference pvVar2;
  InterfaceBlock *pIVar3;
  VariableDeclaration *pVVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  bool local_37d;
  Storage local_37c;
  allocator<char> local_369;
  string local_368;
  MessageBuilder local_348;
  MessageBuilder local_1b8;
  uint local_38;
  Storage local_34;
  int expected;
  Storage storage;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  PerPatchValidator *this_local;
  
  _expected = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  pvVar2 = std::
           vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           ::front(path);
  bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isInterfaceBlock(pvVar2);
  if (bVar1) {
    pvVar2 = std::
             vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                      *)resource_local);
    pIVar3 = ProgramInterfaceDefinition::VariablePathComponent::getInterfaceBlock(pvVar2);
    local_37c = pIVar3->storage;
  }
  else {
    pvVar2 = std::
             vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                      *)resource_local);
    pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getDeclaration(pvVar2);
    local_37c = pVVar4->storage;
  }
  local_34 = local_37c;
  local_37d = local_37c == STORAGE_PATCH_IN || local_37c == STORAGE_PATCH_OUT;
  local_38 = (uint)local_37d;
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1b8,
                      (char (*) [53])"Verifying if is per patch, expecting IS_PER_PATCH = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_38);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  if (implementationName_local._4_4_ != local_38) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_348,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_348,(char (*) [13])"\tError, got ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&implementationName_local + 4));
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"resource is per patch invalid",&local_369);
    PropValidator::setError((PropValidator *)this,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
  }
  return;
}

Assistant:

void PerPatchValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const glu::Storage	storage		= (path.front().isInterfaceBlock()) ? (path.front().getInterfaceBlock()->storage) : (path.front().getDeclaration()->storage);
	const int			expected	= (storage == glu::STORAGE_PATCH_IN || storage == glu::STORAGE_PATCH_OUT) ? (1) : (0);

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying if is per patch, expecting IS_PER_PATCH = " << expected << tcu::TestLog::EndMessage;

	if (propValue != expected)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
		setError("resource is per patch invalid");
	}
}